

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O3

void __thiscall avro::StreamWriter::more(StreamWriter *this)

{
  int iVar1;
  undefined8 *puVar2;
  size_t n;
  long local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_48 = 0;
  do {
    iVar1 = (*this->out_->_vptr_OutputStream[2])(this->out_,&this->next_,&local_48);
    if ((char)iVar1 == '\0') {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"EOF reached","");
      std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),(string *)local_40);
      *puVar2 = 0x1cc910;
      puVar2[1] = 0x1cc940;
      __cxa_throw(puVar2,&Exception::typeinfo,Exception::~Exception);
    }
  } while (local_48 == 0);
  this->end_ = this->next_ + local_48;
  return;
}

Assistant:

void more() {
        size_t n = 0;
        while (out_->next(&next_, &n)) {
            if (n != 0) {
                end_ = next_ + n;
                return;
            }
        }
        throw Exception("EOF reached");
    }